

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O3

int secp256k1_aggsig_verify
              (secp256k1_context *ctx,secp256k1_scratch_space *scratch,uchar *sig64,uchar *msg32,
              secp256k1_pubkey *pubkeys,size_t n_pubkeys)

{
  int iVar1;
  int overflow;
  secp256k1_fe r_x;
  secp256k1_scalar g_sc;
  secp256k1_verify_callback_data cbdata;
  secp256k1_gej pk_sum;
  secp256k1_ge pk_sum_ge;
  int local_1dc;
  secp256k1_fe local_1d8;
  secp256k1_scalar local_1a8;
  secp256k1_fe local_188;
  secp256k1_context *local_158;
  uchar local_150 [64];
  secp256k1_pubkey *local_110;
  secp256k1_gej local_108;
  secp256k1_ge local_88;
  
  if ((ctx->ecmult_ctx).pre_g == (secp256k1_ge_storage_0_ *)0x0) {
    secp256k1_aggsig_verify_cold_1();
  }
  else {
    if (n_pubkeys == 0) {
      return 0;
    }
    iVar1 = secp256k1_fe_set_b32(&local_1d8,sig64);
    if (iVar1 == 0) {
      return 0;
    }
    secp256k1_scalar_set_b32(&local_1a8,sig64 + 0x20,&local_1dc);
    if (local_1dc == 0) {
      local_158 = ctx;
      local_110 = pubkeys;
      secp256k1_compute_prehash(ctx,local_150,pubkeys,n_pubkeys,&local_1d8,msg32);
      iVar1 = secp256k1_ecmult_multi_var
                        (&ctx->ecmult_ctx,scratch,&local_108,&local_1a8,
                         secp256k1_aggsig_verify_callback,&local_158,n_pubkeys);
      if (iVar1 == 0) {
        return 0;
      }
      secp256k1_ge_set_gej(&local_88,&local_108);
      local_188.n[0] = (local_88.x.n[0] - local_1d8.n[0]) + 0x3ffffbfffff0bc;
      local_188.n[1] = (local_88.x.n[1] - local_1d8.n[1]) + 0x3ffffffffffffc;
      local_188.n[2] = (local_88.x.n[2] - local_1d8.n[2]) + 0x3ffffffffffffc;
      local_188.n[3] = (local_88.x.n[3] - local_1d8.n[3]) + 0x3ffffffffffffc;
      local_188.n[4] = (local_88.x.n[4] - local_1d8.n[4]) + 0x3fffffffffffc;
      iVar1 = secp256k1_fe_normalizes_to_zero_var(&local_188);
      if (iVar1 == 0) {
        return 0;
      }
      iVar1 = secp256k1_gej_has_quad_y_var(&local_108);
      return iVar1;
    }
  }
  return 0;
}

Assistant:

int secp256k1_aggsig_verify(const secp256k1_context* ctx, secp256k1_scratch_space *scratch, const unsigned char *sig64, const unsigned char *msg32, const secp256k1_pubkey *pubkeys, size_t n_pubkeys) {
    secp256k1_scalar g_sc;
    secp256k1_gej pk_sum;
    secp256k1_ge pk_sum_ge;
    secp256k1_fe r_x;
    int overflow;
    secp256k1_verify_callback_data cbdata;

    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(secp256k1_ecmult_context_is_built(&ctx->ecmult_ctx));
    ARG_CHECK(scratch != NULL);
    ARG_CHECK(sig64 != NULL);
    ARG_CHECK(msg32 != NULL);
    ARG_CHECK(pubkeys != NULL);
    (void) ctx;

    if (n_pubkeys == 0) {
        return 0;
    }

    /* extract R */
    if (!secp256k1_fe_set_b32(&r_x, sig64)) {
        return 0;
    }

    /* extract s */
    secp256k1_scalar_set_b32(&g_sc, sig64 + 32, &overflow);
    if (overflow) {
        return 0;
    }

    /* Populate callback data */
    cbdata.ctx = ctx;
    cbdata.pubkeys = pubkeys;
    secp256k1_compute_prehash(ctx, cbdata.prehash, pubkeys, n_pubkeys, &r_x, msg32);

    /* Compute sum sG - e_i*P_i, which should be R */
    if (!secp256k1_ecmult_multi_var(&ctx->ecmult_ctx, scratch, &pk_sum, &g_sc, secp256k1_aggsig_verify_callback, &cbdata, n_pubkeys)) {
        return 0;
    }

    /* Check sum */
    secp256k1_ge_set_gej(&pk_sum_ge, &pk_sum);
    return secp256k1_fe_equal_var(&r_x, &pk_sum_ge.x) &&
           secp256k1_gej_has_quad_y_var(&pk_sum);
}